

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O1

void __thiscall QKmsScreenConfig::loadConfig(QKmsScreenConfig *this)

{
  QArrayData *pQVar1;
  qsizetype qVar2;
  QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>
  *pQVar3;
  int *piVar4;
  Data *pDVar5;
  storage_type *psVar6;
  QDebug QVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  Stream *__old_val;
  long lVar11;
  QMap<QString,_QMap<QString,_QVariant>_> *this_00;
  const_iterator cVar12;
  const_iterator cVar13;
  long lVar14;
  undefined8 *puVar15;
  char *pcVar16;
  char16_t *pcVar17;
  char *pcVar18;
  long in_FS_OFFSET;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QLatin1String QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QLatin1String QVar26;
  QLatin1String QVar27;
  QLatin1String QVar28;
  QLatin1String QVar29;
  QLatin1String QVar30;
  QLatin1String QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QAnyStringView QVar46;
  QAnyStringView QVar47;
  QAnyStringView QVar48;
  QVariantMap outputSettings;
  QJsonArray outputs;
  QSize headlessSize;
  QJsonObject object;
  QJsonDocument doc;
  QDebug local_150;
  QtPrivate local_148 [8];
  QString local_140;
  key_type local_128;
  QMap<QString,_QVariant> local_110;
  undefined8 local_108;
  QSize local_100;
  QString local_f8;
  QDebug local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined1 local_b0 [8];
  char *local_a8;
  qsizetype qStack_a0;
  QArrayData *local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  QString local_78;
  undefined8 local_60;
  QString local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = (storage_type *)0xaaaaaaaaaaaaaaaa;
  local_98 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
  uStack_90 = (undefined8 *)0xaaaaaaaaaaaaaaaa;
  qgetenv((char *)&local_98);
  if (local_88 == (storage_type *)0x0) {
    qgetenv((char *)&local_58);
    pQVar1 = (QArrayData *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_);
    puVar15 = (undefined8 *)CONCAT44(local_58.d.ptr._4_4_,local_58.d.ptr._0_4_);
    local_58.d.d._0_4_ = SUB84(local_98,0);
    local_58.d.d._4_4_ = (undefined4)((ulong)local_98 >> 0x20);
    psVar6 = (storage_type *)CONCAT44(local_58.d.size._4_4_,(undefined4)local_58.d.size);
    local_58.d.ptr._0_4_ = (undefined4)uStack_90;
    local_58.d.ptr._4_4_ = uStack_90._4_4_;
    local_58.d.size._0_4_ = (undefined4)local_88;
    local_58.d.size._4_4_ = local_88._4_4_;
    uStack_90 = puVar15;
    local_88 = psVar6;
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,1,0x10);
        local_98 = pQVar1;
        pQVar1 = local_98;
      }
    }
    local_98 = pQVar1;
    if (local_88 == (storage_type *)0x0) goto LAB_0011cd33;
  }
  qLcKmsDebug();
  if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_58.d.d._0_4_ = 2;
    local_58.d.d._4_4_ = 0;
    local_58.d.ptr._0_4_ = 0;
    local_58.d.ptr._4_4_ = 0;
    local_58.d.size._0_4_ = 0;
    local_58.d.size._4_4_ = 0;
    local_40 = qLcKmsDebug::category.name;
    QMessageLogger::debug();
    QVar7.stream = local_d8.stream;
    QVar19.m_data = (storage_type *)0x16;
    QVar19.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar19);
    QTextStream::operator<<((QTextStream *)QVar7.stream,&local_78);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((char)(((QArrayData *)(local_d8.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_d8.stream,' ');
    }
    puVar15 = uStack_90;
    if (uStack_90 == (undefined8 *)0x0) {
      puVar15 = &QByteArray::_empty;
    }
    QDebug::putByteArray((char *)&local_d8,(ulong)puVar15,(Latin1Content)local_88);
    if ((char)(((QArrayData *)(local_d8.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_d8.stream,' ');
    }
    QDebug::~QDebug(&local_d8);
  }
  local_a8 = (char *)0xaaaaaaaaaaaaaaaa;
  qStack_a0 = -0x5555555555555556;
  QVar20.m_data = local_88;
  QVar20.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar20);
  QFile::QFile((QFile *)&local_a8,&local_58);
  piVar4 = (int *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_),2,0x10);
    }
  }
  cVar8 = QFile::open(&local_a8,1);
  if (cVar8 == '\0') {
    qLcKmsDebug();
    if (((byte)qLcKmsDebug::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      local_58.d.d._0_4_ = 2;
      local_58.d.d._4_4_ = 0;
      local_58.d.ptr._0_4_ = 0;
      local_58.d.ptr._4_4_ = 0;
      local_58.d.size._0_4_ = 0;
      local_58.d.size._4_4_ = 0;
      local_40 = qLcKmsDebug::category.name;
      QMessageLogger::warning();
      QVar7.stream = local_d8.stream;
      QVar22.m_data = (storage_type *)0x1a;
      QVar22.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar22);
      QTextStream::operator<<((QTextStream *)QVar7.stream,&local_78);
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)(((QArrayData *)(local_d8.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_d8.stream,' ');
      }
      puVar15 = uStack_90;
      if (uStack_90 == (undefined8 *)0x0) {
        puVar15 = &QByteArray::_empty;
      }
      QDebug::putByteArray((char *)&local_d8,(ulong)puVar15,(Latin1Content)local_88);
      if ((char)(((QArrayData *)(local_d8.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_d8.stream,' ');
      }
      QVar7.stream = local_d8.stream;
      QVar23.m_data = (storage_type *)0xb;
      QVar23.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar23);
      QTextStream::operator<<((QTextStream *)QVar7.stream,&local_78);
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)(((QArrayData *)(local_d8.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_d8.stream,' ');
      }
      QDebug::~QDebug(&local_d8);
    }
  }
  else {
    local_b0 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
    QIODevice::readAll();
    QJsonDocument::fromJson((QByteArray *)local_b0,(QJsonParseError *)&local_58);
    piVar4 = (int *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_),1,0x10)
        ;
      }
    }
    cVar8 = QJsonDocument::isObject();
    if (cVar8 == '\0') {
      qLcKmsDebug();
      if (((byte)qLcKmsDebug::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0)
      {
        local_58.d.d._0_4_ = 2;
        local_58.d.d._4_4_ = 0;
        local_58.d.ptr._0_4_ = 0;
        local_58.d.ptr._4_4_ = 0;
        local_58.d.size._0_4_ = 0;
        local_58.d.size._4_4_ = 0;
        local_40 = qLcKmsDebug::category.name;
        QMessageLogger::warning();
        QVar7.stream = local_d8.stream;
        QVar24.m_data = (storage_type *)0x13;
        QVar24.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar24);
        QTextStream::operator<<((QTextStream *)QVar7.stream,&local_78);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)(((QArrayData *)(local_d8.stream + 0x30))->ref_)._q_value.super___atomic_base<int>
                  ._M_i == '\x01') {
          QTextStream::operator<<((QTextStream *)local_d8.stream,' ');
        }
        puVar15 = uStack_90;
        if (uStack_90 == (undefined8 *)0x0) {
          puVar15 = &QByteArray::_empty;
        }
        QDebug::putByteArray((char *)&local_d8,(ulong)puVar15,(Latin1Content)local_88);
        if ((char)(((QArrayData *)(local_d8.stream + 0x30))->ref_)._q_value.super___atomic_base<int>
                  ._M_i == '\x01') {
          QTextStream::operator<<((QTextStream *)local_d8.stream,' ');
        }
        QVar7.stream = local_d8.stream;
        QVar25.m_data = (storage_type *)0x1a;
        QVar25.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar25);
        QTextStream::operator<<((QTextStream *)QVar7.stream,&local_78);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)(((QArrayData *)(local_d8.stream + 0x30))->ref_)._q_value.super___atomic_base<int>
                  ._M_i == '\x01') {
          QTextStream::operator<<((QTextStream *)local_d8.stream,' ');
        }
        QDebug::~QDebug(&local_d8);
      }
    }
    else {
      local_b8 = 0xaaaaaaaaaaaaaaaa;
      QJsonDocument::object();
      local_c8 = 0xaaaaaaaaaaaaaaaa;
      local_d8.stream = (Stream *)0xaaaaaaaaaaaaaaaa;
      uStack_d0 = 0xaaaaaaaaaaaaaaaa;
      QVar21.m_data = (char *)&local_b8;
      QVar21.m_size = (qsizetype)&local_58;
      QJsonObject::value(QVar21);
      QJsonValue::toString();
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
      local_f8.d.size = -0x5555555555555556;
      local_f8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_f8.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      QString::toUtf8_helper(&local_f8);
      local_100.wd.m_i = -1;
      local_100.ht.m_i = -1;
      pcVar17 = local_f8.d.ptr;
      if (local_f8.d.ptr == (char16_t *)0x0) {
        pcVar17 = (char16_t *)&QByteArray::_empty;
      }
      iVar10 = __isoc99_sscanf(pcVar17,"%dx%d",&local_100);
      if (iVar10 == 2) {
        this->m_headless = true;
        this->m_headlessSize = local_100;
      }
      else {
        this->m_headless = false;
      }
      QVar26.m_data = (char *)&local_b8;
      QVar26.m_size = (qsizetype)&local_58;
      QJsonObject::value(QVar26);
      bVar9 = (bool)QJsonValue::toBool(SUB81((QJsonValue *)&local_58,0));
      this->m_hwCursor = bVar9;
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
      QVar27.m_data = (char *)&local_b8;
      QVar27.m_size = (qsizetype)&local_58;
      QJsonObject::value(QVar27);
      bVar9 = (bool)QJsonValue::toBool(SUB81((QJsonValue *)&local_58,0));
      this->m_pbuffers = bVar9;
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
      QVar28.m_data = (char *)&local_b8;
      QVar28.m_size = (qsizetype)&local_78;
      QJsonObject::value(QVar28);
      QJsonValue::toString();
      pQVar1 = &((this->m_devicePath).d.d)->super_QArrayData;
      pcVar17 = (this->m_devicePath).d.ptr;
      pDVar5 = (Data *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_);
      local_58.d.d._0_4_ = SUB84(pQVar1,0);
      local_58.d.d._4_4_ = (undefined4)((ulong)pQVar1 >> 0x20);
      (this->m_devicePath).d.d = pDVar5;
      (this->m_devicePath).d.ptr = (char16_t *)CONCAT44(local_58.d.ptr._4_4_,local_58.d.ptr._0_4_);
      local_58.d.ptr._0_4_ = SUB84(pcVar17,0);
      local_58.d.ptr._4_4_ = (undefined4)((ulong)pcVar17 >> 0x20);
      qVar2 = (this->m_devicePath).d.size;
      (this->m_devicePath).d.size = CONCAT44(local_58.d.size._4_4_,(undefined4)local_58.d.size);
      local_58.d.size._0_4_ = (undefined4)qVar2;
      local_58.d.size._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      QJsonValue::~QJsonValue((QJsonValue *)&local_78);
      QVar29.m_data = (char *)&local_b8;
      QVar29.m_size = (qsizetype)&local_58;
      QJsonObject::value(QVar29);
      bVar9 = (bool)QJsonValue::toBool(SUB81((QJsonValue *)&local_58,0));
      this->m_separateScreens = bVar9;
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
      QVar30.m_data = (char *)&local_b8;
      QVar30.m_size = (qsizetype)&local_58;
      QJsonObject::value(QVar30);
      QVar48.m_size = 0;
      QVar48.field_0.m_data_utf8 = (char *)&local_58;
      QVar48 = (QAnyStringView)QJsonValue::toStringView(QVar48);
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
      if (((undefined1  [16])QVar48 & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0
         ) {
        QVar46.m_size = 0x400000000000000a;
        QVar46.field_0.m_data_utf8 = "horizontal";
        cVar8 = QAnyStringView::equal(QVar48,QVar46);
        if (cVar8 == '\0') {
          QVar47.m_size = 0x4000000000000008;
          QVar47.field_0.m_data_utf8 = "vertical";
          cVar8 = QAnyStringView::equal(QVar48,QVar47);
          if (cVar8 == '\0') {
            qLcKmsDebug();
            if (((byte)qLcKmsDebug::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
                != 0) {
              loadConfig();
            }
          }
          else {
            this->m_virtualDesktopLayout = VirtualDesktopLayoutVertical;
          }
        }
        else {
          this->m_virtualDesktopLayout = VirtualDesktopLayoutHorizontal;
        }
      }
      local_108 = 0xaaaaaaaaaaaaaaaa;
      QVar31.m_data = (char *)&local_b8;
      QVar31.m_size = (qsizetype)&local_58;
      QJsonObject::value(QVar31);
      QJsonValue::toArray();
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
      lVar11 = QJsonArray::size();
      if (0 < lVar11) {
        this_00 = &this->m_outputSettings;
        lVar11 = 0;
        do {
          local_110.d.d.ptr =
               (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                )(totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
                  )0xaaaaaaaaaaaaaaaa;
          QJsonArray::at((longlong)&local_58);
          QJsonValue::toObject();
          QJsonObject::toVariantMap();
          QJsonObject::~QJsonObject((QJsonObject *)&local_78);
          QJsonValue::~QJsonValue((QJsonValue *)&local_58);
          local_58.d.d._0_4_ = 0;
          local_58.d.d._4_4_ = 0;
          local_58.d.ptr._0_4_ = 0x1297e0;
          local_58.d.ptr._4_4_ = 0;
          local_58.d.size._0_4_ = 4;
          local_58.d.size._4_4_ = 0;
          if (local_110.d.d.ptr ==
              (totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
               )0x0) {
            bVar9 = false;
          }
          else {
            cVar12 = std::
                     _Rb_tree<QString,_std::pair<const_QString,_QVariant>,_std::_Select1st<std::pair<const_QString,_QVariant>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>
                     ::find((_Rb_tree<QString,_std::pair<const_QString,_QVariant>,_std::_Select1st<std::pair<const_QString,_QVariant>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>
                             *)((long)local_110.d.d.ptr + 8),(key_type *)&local_58);
            bVar9 = cVar12._M_node != (_Base_ptr)((long)local_110.d.d.ptr + 0x10);
          }
          piVar4 = (int *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_),2,0x10);
            }
          }
          if (bVar9) {
            local_128.d.size = -0x5555555555555556;
            local_128.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_128.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            local_140.d.d = (Data *)0x0;
            local_140.d.ptr = L"name";
            local_140.d.size = 4;
            local_78.d.size = 0;
            local_78.d.d = (Data *)0x0;
            local_78.d.ptr = (char16_t *)0x0;
            local_60 = 2;
            QMap<QString,_QVariant>::value
                      ((QVariant *)&local_58,&local_110,&local_140,(QVariant *)&local_78);
            QVariant::toString();
            QVariant::~QVariant((QVariant *)&local_58);
            QVariant::~QVariant((QVariant *)&local_78);
            if (&(local_140.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_140.d.d)->super_QArrayData,2,0x10);
              }
            }
            pQVar3 = (this_00->d).d.ptr;
            if (pQVar3 != (QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>
                           *)0x0) {
              cVar13 = std::
                       _Rb_tree<QString,_std::pair<const_QString,_QMap<QString,_QVariant>_>,_std::_Select1st<std::pair<const_QString,_QMap<QString,_QVariant>_>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>
                       ::find(&(pQVar3->m)._M_t,&local_128);
              if ((_Rb_tree_header *)cVar13._M_node !=
                  &(((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
                qLcKmsDebug();
                if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i &
                    1) != 0) {
                  local_58.d.d._0_4_ = 2;
                  local_58.d.d._4_4_ = 0;
                  local_58.d.ptr._0_4_ = 0;
                  local_58.d.ptr._4_4_ = 0;
                  local_58.d.size._0_4_ = 0;
                  local_58.d.size._4_4_ = 0;
                  local_40 = qLcKmsDebug::category.name;
                  QMessageLogger::debug();
                  pDVar5 = local_140.d.d;
                  QVar32.m_data = (storage_type *)0x6;
                  QVar32.m_size = (qsizetype)&local_78;
                  QString::fromUtf8(QVar32);
                  QTextStream::operator<<((QTextStream *)pDVar5,&local_78);
                  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((char)local_140.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>
                            ._M_i == '\x01') {
                    QTextStream::operator<<((QTextStream *)local_140.d.d,' ');
                  }
                  pcVar17 = local_128.d.ptr;
                  if (local_128.d.ptr == (char16_t *)0x0) {
                    pcVar17 = (char16_t *)&QString::_empty;
                  }
                  QDebug::putString((QChar *)&local_140,(ulong)pcVar17);
                  if ((char)local_140.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>
                            ._M_i == '\x01') {
                    QTextStream::operator<<((QTextStream *)local_140.d.d,' ');
                  }
                  pDVar5 = local_140.d.d;
                  QVar33.m_data = (storage_type *)0x1a;
                  QVar33.m_size = (qsizetype)&local_78;
                  QString::fromUtf8(QVar33);
                  QTextStream::operator<<((QTextStream *)pDVar5,&local_78);
                  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((char)local_140.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>
                            ._M_i == '\x01') {
                    QTextStream::operator<<((QTextStream *)local_140.d.d,' ');
                  }
                  QDebug::~QDebug((QDebug *)&local_140);
                }
              }
            }
            QMap<QString,_QMap<QString,_QVariant>_>::insert(this_00,&local_128,&local_110);
            if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
          ::~QExplicitlySharedDataPointerV2(&local_110.d);
          lVar11 = lVar11 + 1;
          lVar14 = QJsonArray::size();
        } while (lVar11 < lVar14);
      }
      qLcKmsDebug();
      if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_58.d.d._0_4_ = 2;
        local_58.d.d._4_4_ = 0;
        local_58.d.ptr._0_4_ = 0;
        local_58.d.ptr._4_4_ = 0;
        local_58.d.size._0_4_ = 0;
        local_58.d.size._4_4_ = 0;
        local_40 = qLcKmsDebug::category.name;
        QMessageLogger::debug();
        pDVar5 = local_128.d.d;
        QVar34.m_data = (storage_type *)0x38;
        QVar34.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar34);
        QTextStream::operator<<((QTextStream *)pDVar5,&local_78);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        pDVar5 = local_128.d.d;
        QVar35.m_data = (storage_type *)0xa;
        QVar35.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar35);
        QTextStream::operator<<((QTextStream *)pDVar5,&local_78);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        pcVar18 = "false";
        pcVar16 = "false";
        if (this->m_headless != false) {
          pcVar16 = "true";
        }
        QTextStream::operator<<((QTextStream *)local_128.d.d,pcVar16);
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        pDVar5 = local_128.d.d;
        QVar36.m_data = (storage_type *)0x1;
        QVar36.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar36);
        QTextStream::operator<<((QTextStream *)pDVar5,&local_78);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        pDVar5 = local_128.d.d;
        QVar37.m_data = (storage_type *)0xa;
        QVar37.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar37);
        QTextStream::operator<<((QTextStream *)pDVar5,&local_78);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        pcVar16 = "false";
        if (this->m_hwCursor != false) {
          pcVar16 = "true";
        }
        QTextStream::operator<<((QTextStream *)local_128.d.d,pcVar16);
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        pDVar5 = local_128.d.d;
        QVar38.m_data = (storage_type *)0x1;
        QVar38.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar38);
        QTextStream::operator<<((QTextStream *)pDVar5,&local_78);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        pDVar5 = local_128.d.d;
        QVar39.m_data = (storage_type *)0xa;
        QVar39.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar39);
        QTextStream::operator<<((QTextStream *)pDVar5,&local_78);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        pcVar16 = "false";
        if (this->m_pbuffers != false) {
          pcVar16 = "true";
        }
        QTextStream::operator<<((QTextStream *)local_128.d.d,pcVar16);
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        pDVar5 = local_128.d.d;
        QVar40.m_data = (storage_type *)0x1;
        QVar40.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar40);
        QTextStream::operator<<((QTextStream *)pDVar5,&local_78);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        pDVar5 = local_128.d.d;
        QVar41.m_data = (storage_type *)0x11;
        QVar41.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar41);
        QTextStream::operator<<((QTextStream *)pDVar5,&local_78);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        if (this->m_separateScreens != false) {
          pcVar18 = "true";
        }
        QTextStream::operator<<((QTextStream *)local_128.d.d,pcVar18);
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        pDVar5 = local_128.d.d;
        QVar42.m_data = (storage_type *)0x1;
        QVar42.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar42);
        QTextStream::operator<<((QTextStream *)pDVar5,&local_78);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        pDVar5 = local_128.d.d;
        QVar43.m_data = (storage_type *)0x16;
        QVar43.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar43);
        QTextStream::operator<<((QTextStream *)pDVar5,&local_78);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        QTextStream::operator<<((QTextStream *)local_128.d.d,this->m_virtualDesktopLayout);
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        pDVar5 = local_128.d.d;
        QVar44.m_data = (storage_type *)0x1;
        QVar44.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar44);
        QTextStream::operator<<((QTextStream *)pDVar5,&local_78);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        pDVar5 = local_128.d.d;
        QVar45.m_data = (storage_type *)0x9;
        QVar45.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar45);
        QTextStream::operator<<((QTextStream *)pDVar5,&local_78);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        *(int *)&local_128.d.d[2].super_QArrayData.alloc =
             (int)local_128.d.d[2].super_QArrayData.alloc + 1;
        local_150.stream = (Stream *)0x0;
        local_78.d.d = local_128.d.d;
        QtPrivate::printAssociativeContainer<QMap<QString,QMap<QString,QVariant>>>
                  (local_148,(Stream *)&local_78,"QMap",&this->m_outputSettings);
        QDebug::~QDebug((QDebug *)&local_78);
        QDebug::~QDebug((QDebug *)local_148);
        QDebug::~QDebug(&local_150);
        QDebug::~QDebug((QDebug *)&local_128);
      }
      QJsonArray::~QJsonArray((QJsonArray *)&local_108);
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,1,0x10);
        }
      }
      if ((QArrayData *)local_d8.stream != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_d8.stream = *(int *)local_d8.stream + -1;
        UNLOCK();
        if (*(int *)local_d8.stream == 0) {
          QArrayData::deallocate((QArrayData *)local_d8.stream,2,0x10);
        }
      }
      QJsonObject::~QJsonObject((QJsonObject *)&local_b8);
    }
    QJsonDocument::~QJsonDocument((QJsonDocument *)local_b0);
  }
  QFile::~QFile((QFile *)&local_a8);
LAB_0011cd33:
  if (local_98 != (QArrayData *)0x0) {
    LOCK();
    (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_98,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QKmsScreenConfig::loadConfig()
{
    QByteArray json = qgetenv("QT_QPA_EGLFS_KMS_CONFIG");
    if (json.isEmpty()) {
        json = qgetenv("QT_QPA_KMS_CONFIG");
        if (json.isEmpty())
            return;
    }

    qCDebug(qLcKmsDebug) << "Loading KMS setup from" << json;

    QFile file(QString::fromUtf8(json));
    if (!file.open(QFile::ReadOnly)) {
        qCWarning(qLcKmsDebug) << "Could not open config file"
                               << json << "for reading";
        return;
    }

    const QJsonDocument doc = QJsonDocument::fromJson(file.readAll());
    if (!doc.isObject()) {
        qCWarning(qLcKmsDebug) << "Invalid config file" << json
                              << "- no top-level JSON object";
        return;
    }

    const QJsonObject object = doc.object();

    const QString headlessStr = object.value("headless"_L1).toString();
    const QByteArray headless = headlessStr.toUtf8();
    QSize headlessSize;
    if (sscanf(headless.constData(), "%dx%d", &headlessSize.rwidth(), &headlessSize.rheight()) == 2) {
        m_headless = true;
        m_headlessSize = headlessSize;
    } else {
        m_headless = false;
    }

    m_hwCursor = object.value("hwcursor"_L1).toBool(m_hwCursor);
    m_pbuffers = object.value("pbuffers"_L1).toBool(m_pbuffers);
    m_devicePath = object.value("device"_L1).toString();
    m_separateScreens = object.value("separateScreens"_L1).toBool(m_separateScreens);

    const auto vdOriString = object.value("virtualDesktopLayout"_L1).toStringView();
    if (!vdOriString.isEmpty()) {
        if (vdOriString == "horizontal"_L1)
            m_virtualDesktopLayout = VirtualDesktopLayoutHorizontal;
        else if (vdOriString == "vertical"_L1)
            m_virtualDesktopLayout = VirtualDesktopLayoutVertical;
        else
            qCWarning(qLcKmsDebug, "Unknown virtualDesktopOrientation value %ls",
                      qUtf16Printable(vdOriString.toString()));
    }

    const QJsonArray outputs = object.value("outputs"_L1).toArray();
    for (int i = 0; i < outputs.size(); i++) {
        const QVariantMap outputSettings = outputs.at(i).toObject().toVariantMap();

        if (outputSettings.contains(QStringLiteral("name"))) {
            const QString name = outputSettings.value(QStringLiteral("name")).toString();

            if (m_outputSettings.contains(name)) {
                qCDebug(qLcKmsDebug) << "Output" << name << "configured multiple times!";
            }

            m_outputSettings.insert(name, outputSettings);
        }
    }

    qCDebug(qLcKmsDebug) << "Requested configuration (some settings may be ignored):\n"
                         << "\theadless:" << m_headless << "\n"
                         << "\thwcursor:" << m_hwCursor << "\n"
                         << "\tpbuffers:" << m_pbuffers << "\n"
                         << "\tseparateScreens:" << m_separateScreens << "\n"
                         << "\tvirtualDesktopLayout:" << m_virtualDesktopLayout << "\n"
                         << "\toutputs:" << m_outputSettings;
}